

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O0

void __thiscall
OpenMD::Electrostatic::getSitePotentials
          (Electrostatic *this,Atom *a1,Atom *a2,bool excluded,RealType *spot1,RealType *spot2)

{
  reference pvVar1;
  SnapshotManager *this_00;
  byte in_CL;
  Atom *in_RDX;
  Atom *in_RSI;
  Vector<double,_3U> *in_RDI;
  double *in_R8;
  double *in_R9;
  RealType RVar2;
  double dVar3;
  RealType ri;
  RealType rij;
  Vector3d d;
  int atid2;
  int atid1;
  AtomType *atype2;
  AtomType *atype1;
  RealType mPoleConverter;
  Electrostatic *in_stack_00000600;
  ElectrostaticAtomData *in_stack_fffffffffffffca8;
  ElectrostaticAtomData *in_stack_fffffffffffffcb0;
  SquareMatrix<double,_3> *this_01;
  StuntDouble *in_stack_fffffffffffffcb8;
  double *v1;
  double *m;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffcd8;
  RealType *in_stack_fffffffffffffd08;
  CubicSpline *in_stack_fffffffffffffd10;
  Vector3d *in_stack_fffffffffffffd28;
  Snapshot *in_stack_fffffffffffffd30;
  RectMatrix<double,_3U,_3U> local_2c8 [3];
  undefined1 local_1e0 [288];
  double local_c0;
  double local_b8;
  int local_50;
  int local_4c;
  AtomType *local_48;
  AtomType *local_40;
  undefined8 local_38;
  double *local_30;
  double *local_28;
  byte local_19;
  Atom *local_18;
  Atom *local_10;
  
  local_19 = in_CL & 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (((ulong)in_RDI[1].data_[2] & 1) == 0) {
    initialize(in_stack_00000600);
  }
  local_38 = 0x3fcaa61cb4c19333;
  local_40 = Atom::getAtomType(local_10);
  local_48 = Atom::getAtomType(local_18);
  local_4c = AtomType::getIdent(local_40);
  local_50 = AtomType::getIdent(local_48);
  v1 = in_RDI[8].data_ + 1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI[4].data_ + 1),(long)local_4c);
  std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
  operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
              *)v1,(long)*pvVar1);
  ElectrostaticAtomData::operator=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  m = in_RDI[8].data_ + 1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI[4].data_ + 1),(long)local_50);
  std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
  operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
              *)m,(long)*pvVar1);
  ElectrostaticAtomData::operator=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  in_RDI[0x57].data_[2] = 0.0;
  in_RDI[0x58].data_[0] = 0.0;
  StuntDouble::getPos(in_stack_fffffffffffffcb8);
  StuntDouble::getPos(in_stack_fffffffffffffcb8);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffcb8,
                    (Vector<double,_3U> *)in_stack_fffffffffffffcb0);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffcb0,
             (Vector<double,_3U> *)in_stack_fffffffffffffca8);
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[10].data_[1]);
  SnapshotManager::getCurrentSnapshot(this_00);
  Snapshot::wrapVector(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_b8 = Vector<double,_3U>::length((Vector<double,_3U> *)0x3fcf51);
  local_c0 = 1.0 / local_b8;
  OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffcb8,
                    (double)in_stack_fffffffffffffcb0);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffcb8,
             (Vector<double,_3U> *)in_stack_fffffffffffffcb0);
  if ((in_RDI[0xd].data_[1] <= local_b8) || ((local_19 & 1) != 0)) {
    *local_28 = 0.0;
    *local_30 = 0.0;
  }
  else {
    *(byte *)in_RDI[0x5f].data_ = *(byte *)(in_RDI[0x25].data_ + 1) & 1;
    *(byte *)((long)in_RDI[0x5f].data_ + 1) = *(byte *)((long)in_RDI[0x25].data_ + 9) & 1;
    *(byte *)((long)in_RDI[0x5f].data_ + 2) = *(byte *)((long)in_RDI[0x25].data_ + 10) & 1;
    *(byte *)((long)in_RDI[0x5f].data_ + 3) = *(byte *)((long)in_RDI[0x25].data_ + 0xb) & 1;
    *(byte *)((long)in_RDI[0x5f].data_ + 5) = *(byte *)(in_RDI[0x2b].data_ + 1) & 1;
    *(byte *)((long)in_RDI[0x5f].data_ + 6) = *(byte *)((long)in_RDI[0x2b].data_ + 9) & 1;
    *(byte *)((long)in_RDI[0x5f].data_ + 7) = *(byte *)((long)in_RDI[0x2b].data_ + 10) & 1;
    *(byte *)(in_RDI[0x5f].data_ + 1) = *(byte *)((long)in_RDI[0x2b].data_ + 0xb) & 1;
    if ((((ulong)in_RDI[0x5f].data_[0] & 1) != 0) ||
       (((ulong)in_RDI[0x5f].data_[0] & 0x10000000000) != 0)) {
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3fd095);
      RVar2 = CubicSpline::getValueAt(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      in_RDI[0xf].data_[2] = RVar2;
    }
    if ((((ulong)in_RDI[0x5f].data_[0] & 0x100) != 0) ||
       (((ulong)in_RDI[0x5f].data_[0] & 0x1000000000000) != 0)) {
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3fd0df);
      RVar2 = CubicSpline::getValueAt(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      in_RDI[0x10].data_[0] = RVar2;
      in_RDI[0x15].data_[2] = local_c0 * in_RDI[0x10].data_[0];
    }
    if ((((ulong)in_RDI[0x5f].data_[0] & 0x10000) != 0) ||
       (((ulong)in_RDI[0x5f].data_[0] & 0x100000000000000) != 0)) {
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3fd142);
      RVar2 = CubicSpline::getValueAt(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      in_RDI[0x10].data_[1] = RVar2;
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3fd16b);
      RVar2 = CubicSpline::getValueAt(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      in_RDI[0x10].data_[2] = RVar2;
      in_RDI[0x16].data_[0] = local_c0 * in_RDI[0x10].data_[2];
    }
    if (((ulong)in_RDI[0x5f].data_[0] & 1) != 0) {
      in_RDI[0x31].data_[1] = in_RDI[0x25].data_[2];
      if (((ulong)in_RDI[0x5f].data_[0] & 0x1000000) != 0) {
        RVar2 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_fffffffffffffcb0);
        in_RDI[0x31].data_[1] = RVar2 + in_RDI[0x31].data_[1];
      }
      in_RDI[0x58].data_[0] =
           in_RDI[0x31].data_[1] * in_RDI[0xd].data_[2] * in_RDI[0xf].data_[2] +
           in_RDI[0x58].data_[0];
    }
    if (((ulong)in_RDI[0x5f].data_[0] & 0x100) != 0) {
      StuntDouble::getDipole(in_stack_fffffffffffffcb8);
      OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffcb8,
                        (double)in_stack_fffffffffffffcb0);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffcb8,
                 (Vector<double,_3U> *)in_stack_fffffffffffffcb0);
      dVar3 = dot<double,3u>((Vector<double,_3U> *)v1,
                             (Vector<double,_3U> *)in_stack_fffffffffffffcb8);
      in_RDI[0x3a].data_[1] = dVar3;
      in_RDI[0x58].data_[0] =
           in_RDI[0xe].data_[0] * in_RDI[0x10].data_[0] * in_RDI[0x3a].data_[1] +
           in_RDI[0x58].data_[0];
    }
    if (((ulong)in_RDI[0x5f].data_[0] & 0x10000) != 0) {
      in_stack_fffffffffffffcb8 = (StuntDouble *)local_1e0;
      StuntDouble::getQuadrupole(in_stack_fffffffffffffcb8);
      OpenMD::operator*((RectMatrix<double,_3U,_3U> *)m,(double)v1);
      SquareMatrix<double,_3>::SquareMatrix
                ((SquareMatrix<double,_3> *)in_stack_fffffffffffffcb0,
                 (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffca8);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)in_stack_fffffffffffffcb8,
                 (SquareMatrix<double,_3> *)in_stack_fffffffffffffcb0);
      SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x3fd360);
      RectMatrix<double,_3U,_3U>::~RectMatrix((RectMatrix<double,_3U,_3U> *)(local_1e0 + 0x48));
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3fd37a);
      dVar3 = SquareMatrix3<double>::trace((SquareMatrix3<double> *)(in_RDI + 0x34));
      in_RDI[0x3d].data_[2] = dVar3;
      OpenMD::operator*(in_stack_fffffffffffffcd8,in_RDI);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffcb8,
                 (Vector<double,_3U> *)in_stack_fffffffffffffcb0);
      dVar3 = dot<double,3u>((Vector<double,_3U> *)v1,
                             (Vector<double,_3U> *)in_stack_fffffffffffffcb8);
      in_RDI[0x3d].data_[0] = dVar3;
      in_RDI[0x58].data_[0] =
           in_RDI[0xe].data_[2] *
           (in_RDI[0x10].data_[1] * in_RDI[0x3d].data_[2] +
           in_RDI[0x10].data_[2] * in_RDI[0x3d].data_[0]) + in_RDI[0x58].data_[0];
    }
    if (((ulong)in_RDI[0x5f].data_[0] & 0x10000000000) != 0) {
      in_RDI[0x31].data_[2] = in_RDI[0x2b].data_[2];
      if (((ulong)in_RDI[0x5f].data_[1] & 1) != 0) {
        RVar2 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_fffffffffffffcb0);
        in_RDI[0x31].data_[2] = RVar2 + in_RDI[0x31].data_[2];
      }
      in_RDI[0x57].data_[2] =
           in_RDI[0x31].data_[2] * in_RDI[0xd].data_[2] * in_RDI[0xf].data_[2] +
           in_RDI[0x57].data_[2];
    }
    if (((ulong)in_RDI[0x5f].data_[0] & 0x1000000000000) != 0) {
      StuntDouble::getDipole(in_stack_fffffffffffffcb8);
      OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffcb8,
                        (double)in_stack_fffffffffffffcb0);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffcb8,
                 (Vector<double,_3U> *)in_stack_fffffffffffffcb0);
      dVar3 = dot<double,3u>((Vector<double,_3U> *)v1,
                             (Vector<double,_3U> *)in_stack_fffffffffffffcb8);
      in_RDI[0x3a].data_[2] = dVar3;
      in_RDI[0x57].data_[2] =
           in_RDI[0xe].data_[0] * in_RDI[0x10].data_[0] * in_RDI[0x3a].data_[2] +
           in_RDI[0x57].data_[2];
    }
    if (((ulong)in_RDI[0x5f].data_[0] & 0x100000000000000) != 0) {
      this_01 = (SquareMatrix<double,_3> *)&stack0xfffffffffffffcf0;
      StuntDouble::getQuadrupole(in_stack_fffffffffffffcb8);
      OpenMD::operator*((RectMatrix<double,_3U,_3U> *)m,(double)v1);
      SquareMatrix<double,_3>::SquareMatrix
                (this_01,(RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffca8);
      SquareMatrix3<double>::operator=((SquareMatrix3<double> *)in_stack_fffffffffffffcb8,this_01);
      SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x3fd669);
      RectMatrix<double,_3U,_3U>::~RectMatrix(local_2c8);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3fd680);
      dVar3 = SquareMatrix3<double>::trace((SquareMatrix3<double> *)(in_RDI + 0x37));
      in_RDI[0x3e].data_[0] = dVar3;
      OpenMD::operator*(in_stack_fffffffffffffcd8,in_RDI);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffcb8,(Vector<double,_3U> *)this_01);
      dVar3 = dot<double,3u>((Vector<double,_3U> *)v1,
                             (Vector<double,_3U> *)in_stack_fffffffffffffcb8);
      in_RDI[0x3d].data_[1] = dVar3;
      in_RDI[0x57].data_[2] =
           in_RDI[0xe].data_[2] *
           (in_RDI[0x10].data_[1] * in_RDI[0x3e].data_[0] +
           in_RDI[0x10].data_[2] * in_RDI[0x3d].data_[1]) + in_RDI[0x57].data_[2];
    }
    *local_28 = in_RDI[0x57].data_[2];
    *local_30 = in_RDI[0x58].data_[0];
  }
  return;
}

Assistant:

void Electrostatic::getSitePotentials(Atom* a1, Atom* a2, bool excluded,
                                        RealType& spot1, RealType& spot2) {
    if (!initialized_) { initialize(); }

    const RealType mPoleConverter = 0.20819434;

    AtomType* atype1 = a1->getAtomType();
    AtomType* atype2 = a2->getAtomType();
    int atid1        = atype1->getIdent();
    int atid2        = atype2->getIdent();
    data1            = ElectrostaticMap[Etids[atid1]];
    data2            = ElectrostaticMap[Etids[atid2]];

    Pa = 0.0;  // Site potential at site a
    Pb = 0.0;  // Site potential at site b

    Vector3d d = a2->getPos() - a1->getPos();
    info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(d);
    RealType rij = d.length();
    // some variables we'll need independent of electrostatic type:

    RealType ri = 1.0 / rij;
    rhat        = d * ri;

    if ((rij >= cutoffRadius_) || excluded) {
      spot1 = 0.0;
      spot2 = 0.0;
      return;
    }

    // logicals

    a_is_Charge      = data1.is_Charge;
    a_is_Dipole      = data1.is_Dipole;
    a_is_Quadrupole  = data1.is_Quadrupole;
    a_is_Fluctuating = data1.is_Fluctuating;

    b_is_Charge      = data2.is_Charge;
    b_is_Dipole      = data2.is_Dipole;
    b_is_Quadrupole  = data2.is_Quadrupole;
    b_is_Fluctuating = data2.is_Fluctuating;

    // Obtain all of the required radial function values from the
    // spline structures:

    if (a_is_Charge || b_is_Charge) { v01 = v01s->getValueAt(rij); }
    if (a_is_Dipole || b_is_Dipole) {
      v11   = v11s->getValueAt(rij);
      v11or = ri * v11;
    }
    if (a_is_Quadrupole || b_is_Quadrupole) {
      v21   = v21s->getValueAt(rij);
      v22   = v22s->getValueAt(rij);
      v22or = ri * v22;
    }

    if (a_is_Charge) {
      C_a = data1.fixedCharge;

      if (a_is_Fluctuating) { C_a += a1->getFlucQPos(); }

      Pb += C_a * pre11_ * v01;
    }

    if (a_is_Dipole) {
      D_a  = a1->getDipole() * mPoleConverter;
      rdDa = dot(rhat, D_a);
      Pb += pre12_ * v11 * rdDa;
    }

    if (a_is_Quadrupole) {
      Q_a   = a1->getQuadrupole() * mPoleConverter;
      trQa  = Q_a.trace();
      Qar   = Q_a * rhat;
      rdQar = dot(rhat, Qar);
      Pb += pre14_ * (v21 * trQa + v22 * rdQar);
    }

    if (b_is_Charge) {
      C_b = data2.fixedCharge;

      if (b_is_Fluctuating) C_b += a2->getFlucQPos();

      Pa += C_b * pre11_ * v01;
    }

    if (b_is_Dipole) {
      D_b  = a2->getDipole() * mPoleConverter;
      rdDb = dot(rhat, D_b);
      Pa += pre12_ * v11 * rdDb;
    }

    if (b_is_Quadrupole) {
      Q_a   = a2->getQuadrupole() * mPoleConverter;
      trQb  = Q_b.trace();
      Qbr   = Q_b * rhat;
      rdQbr = dot(rhat, Qbr);
      Pa += pre14_ * (v21 * trQb + v22 * rdQbr);
    }

    spot1 = Pa;
    spot2 = Pb;
  }